

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

void __thiscall ApplicationContext::CreateCSP(ApplicationContext *this)

{
  char *src;
  size_t len;
  CSP *pCVar1;
  shared_ptr<ApplicationContext> app;
  __shared_ptr<ApplicationContext,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<ApplicationContext,_(__gnu_cxx::_Lock_policy)2> local_110;
  function<void_(int)> local_100;
  function<void_(int)> local_e0;
  function<void_(int)> local_c0;
  function<void_(int)> local_a0;
  function<void_(int)> local_80;
  function<void_(int)> local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  src = csp_ac_src;
  len = strlen(csp_ac_src);
  pCVar1 = csp_parse((CSP *)0x0,src,len);
  this->csp = pCVar1;
  std::__shared_ptr<ApplicationContextBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ApplicationContextBase,void>
            ((__shared_ptr<ApplicationContextBase,(__gnu_cxx::_Lock_policy)2> *)&local_120,
             (__weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ApplicationContextBase).
              super_enable_shared_from_this<ApplicationContextBase>);
  std::dynamic_pointer_cast<ApplicationContext,ApplicationContextBase>
            ((shared_ptr<ApplicationContextBase> *)&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  pCVar1 = this->csp;
  std::__shared_ptr<ApplicationContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,&local_110);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_1_,void>
            ((function<void(int)> *)&local_60,(anon_class_16_1_ba1d3581 *)&local_120);
  csp_bind_lambda(pCVar1,"push_value",&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  pCVar1 = this->csp;
  std::__shared_ptr<ApplicationContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,&local_110);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_2_,void>
            ((function<void(int)> *)&local_80,(anon_class_16_1_ba1d3581 *)&local_120);
  csp_bind_lambda(pCVar1,"pop_value",&local_80);
  std::_Function_base::~_Function_base(&local_80.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  pCVar1 = this->csp;
  std::__shared_ptr<ApplicationContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,&local_110);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_3_,void>
            ((function<void(int)> *)&local_a0,(anon_class_16_1_ba1d3581 *)&local_120);
  csp_bind_lambda(pCVar1,"add",&local_a0);
  std::_Function_base::~_Function_base(&local_a0.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  pCVar1 = this->csp;
  std::__shared_ptr<ApplicationContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,&local_110);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_4_,void>
            ((function<void(int)> *)&local_c0,(anon_class_16_1_ba1d3581 *)&local_120);
  csp_bind_lambda(pCVar1,"subtract",&local_c0);
  std::_Function_base::~_Function_base(&local_c0.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  pCVar1 = this->csp;
  std::__shared_ptr<ApplicationContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,&local_110);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_5_,void>
            ((function<void(int)> *)&local_e0,(anon_class_16_1_ba1d3581 *)&local_120);
  csp_bind_lambda(pCVar1,"multiply",&local_e0);
  std::_Function_base::~_Function_base(&local_e0.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  pCVar1 = this->csp;
  std::__shared_ptr<ApplicationContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,&local_110);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_6_,void>
            ((function<void(int)> *)&local_100,(anon_class_16_1_ba1d3581 *)&local_120);
  csp_bind_lambda(pCVar1,"divide",&local_100);
  std::_Function_base::~_Function_base(&local_100.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:271:42)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:271:42)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  csp_bind_lambda(this->csp,"join_now",(function<void_(int)> *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  return;
}

Assistant:

void CreateCSP()
    {
        csp = csp_parse(nullptr, csp_ac_src, strlen(csp_ac_src));

        /// The execution of actions becomes complicated by the introduction of
        /// undo. The first consideration is that we mustn't keep references to
        /// the application context in all the history's lambdas
        std::shared_ptr<ApplicationContext> app = std::dynamic_pointer_cast<ApplicationContext>(this->shared_from_this());

        csp_bind_lambda(csp, "push_value", [app](int id)
        {
            if (id && app)
            {
                ///>
                /// The append line event comes with a floating point value 
                ///<C++
                TypedData* d = blackboard_get(app->blackboard, id);
                auto td = dynamic_cast<Data<float>*>(d);
                if (td)
                {
///>
/// The operation modified the ApplicationContext, so record the operation
/// in the journal. The journal records both the action that was taken, 
/// and the reverse operation. The inverse of pushing a value on the stack is to pop it.
/// Previously, the journal was a simple record of an action.  Now,
/// we are going to explore more complex actions, with more complex undo
/// behavior. So a more sophisticated journal is required. Since the application
/// is multi-threaded, many actions could occur concurrently. In the case of
/// an action with a simple undo, that's no big deal, since one action is paired
/// with one undo action. In a moment though, we will see an undo action that
/// requires multiple steps that have to go together. We introduce therefore
/// a Journal::Transaction that records a single atomic history/undo pair.
///<C++
                    Journal::Transaction transaction 
                    {  "push_value", 
                        [app, td]() 
                        {
                            app->value_stack.push_back(td->value());
                        },
                        [app]() 
                        { 
                            app->value_stack.pop_back(); 
                        }
                    };
                    transaction.action();
                    app->journal.commit(std::move(transaction));
                }
                else
                {
                    ///>
                    /// The data from the blackboard is not reference counted
                    /// so it must be deleted here.
                    ///<C++
                    delete d;
                }
            }
        });
        csp_bind_lambda(csp, "pop_value", [app](int)
        {
            if (app->value_stack.size())
            {
                // remember the value that was at the back of the value stack.
                float value = *app->value_stack.rbegin();

                /// The inverse of popping a value is to push it again.
                Journal::Transaction transaction
                {
                    "pop_value",
                    [value, app]()
                    {
                        app->value_stack.pop_back();
                    },
                    [value, app]()
                    {
                        app->value_stack.push_back(value);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "add", [app](int)
        {
            ///>
            /// This application is very simple, and doesn't report problems
            /// such as not enough values on the stack. A real application would.
            ///<C++
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                /// the history needs only record that an add occurred.
                /// The undo must remove the result, and push the original values.
                /// This is where the transactional nature of the journal comes
                /// into play.
                Journal::Transaction transaction
                {
                    "add",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 + value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "subtract", [app](int)
        {
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "subtract",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 - value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "multiply", [app](int)
        {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "multiply",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 * value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
        });
        csp_bind_lambda(csp, "divide", [app](int)
        {
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "divide",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 / value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        ///>
        /// The join_now action is here, bound by name to the csp QUIT process.
        ///<C++
        csp_bind_lambda(csp, "join_now", [this](int) { join_now = true; });
    }